

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-perf-events.h
# Opt level: O1

void __thiscall
LinuxEvents<0>::LinuxEvents(LinuxEvents<0> *this,vector<int,_std::allocator<int>_> *config_vec)

{
  undefined1 *puVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int *piVar6;
  undefined1 auVar7 [32];
  string local_50;
  
  this->fd = 0;
  this->working = true;
  (this->attribs).type = 0;
  (this->attribs).size = 0;
  (this->attribs).config = 0;
  (this->attribs).field_3.sample_period = 0;
  (this->attribs).sample_type = 0;
  (this->attribs).read_format = 0;
  *(undefined8 *)&(this->attribs).field_0x28 = 0;
  (this->attribs).field_44 = (anon_union_4_2_10a424aa_for_perf_event_attr_45)0x0;
  (this->attribs).bp_type = 0;
  (this->attribs).field_46.bp_addr = 0;
  (this->attribs).field_47.bp_len = 0;
  (this->attribs).branch_sample_type = 0;
  (this->attribs).sample_regs_user = 0;
  (this->attribs).sample_stack_user = 0;
  (this->attribs).clockid = 0;
  (this->attribs).sample_regs_intr = 0;
  (this->attribs).aux_watermark = 0;
  (this->attribs).sample_max_stack = 0;
  (this->attribs).__reserved_2 = 0;
  (this->attribs).aux_sample_size = 0;
  (this->attribs).__reserved_3 = 0;
  (this->attribs).sig_data = 0;
  auVar7 = ZEXT432(0) << 0x40;
  this->temp_result_vec = (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar7._0_24_;
  (this->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar7._24_8_;
  *(undefined1 (*) [32])
   &(this->temp_result_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = auVar7;
  (this->attribs).size = 0x80;
  puVar1 = &(this->attribs).field_0x28;
  *puVar1 = *puVar1 | 0x61;
  (this->attribs).field_3.sample_period = 0;
  (this->attribs).read_format = 0xc;
  piVar6 = (config_vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (config_vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  this->num_events = (int)((ulong)((long)piVar2 - (long)piVar6) >> 2);
  if (piVar2 != piVar6) {
    uVar5 = 0xffffffff;
    uVar4 = 0;
    do {
      (this->attribs).config = (long)*piVar6;
      lVar3 = syscall(0x12a,&this->attribs,0,0xffffffff,(ulong)uVar5,0);
      this->fd = (int)lVar3;
      if ((int)lVar3 == -1) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"perf_event_open","");
        report_error(this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      ioctl(this->fd,0x80082407,
            (this->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start + uVar4);
      if (uVar5 == 0xffffffff) {
        uVar5 = this->fd;
      }
      uVar4 = (ulong)((int)uVar4 + 1);
      piVar6 = piVar6 + 1;
    } while (piVar6 != piVar2);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->temp_result_vec,(long)this->num_events * 2 + 1);
  return;
}

Assistant:

explicit LinuxEvents(std::vector<int> config_vec) : fd(0), working(true) {
    memset(&attribs, 0, sizeof(attribs));
    attribs.type = TYPE;
    attribs.size = sizeof(attribs);
    attribs.disabled = 1;
    attribs.exclude_kernel = 1;
    attribs.exclude_hv = 1;

    attribs.sample_period = 0;
    attribs.read_format = PERF_FORMAT_GROUP | PERF_FORMAT_ID;
    const int pid = 0;  // the current process
    const int cpu = -1; // all CPUs
    const unsigned long flags = 0;

    int group = -1; // no group
    num_events = config_vec.size();
    uint32_t i = 0;
    for (auto config : config_vec) {
      attribs.config = config;
      fd = syscall(__NR_perf_event_open, &attribs, pid, cpu, group, flags);
      if (fd == -1) {
        report_error("perf_event_open");
      }
      ioctl(fd, PERF_EVENT_IOC_ID, &ids[i++]);
      if (group == -1) {
        group = fd;
      }
    }

    temp_result_vec.resize(num_events * 2 + 1);
  }